

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SettingsHandlerWindow_ReadLine
               (ImGuiContext *ctx,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  ImVec2 IVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float y;
  float x;
  int i;
  float local_24;
  float local_20;
  int local_1c;
  
  iVar2 = __isoc99_sscanf(line,"Pos=%f,%f",&local_20,&local_24);
  if (iVar2 == 2) {
    *(float *)((long)entry + 0xc) = local_20;
    *(float *)((long)entry + 0x10) = local_24;
  }
  else {
    iVar2 = __isoc99_sscanf(line,"Size=%f,%f",&local_20,&local_24);
    if (iVar2 == 2) {
      IVar1 = (ctx->Style).WindowMinSize;
      fVar5 = IVar1.x;
      fVar6 = IVar1.y;
      uVar3 = -(uint)(fVar5 <= local_20);
      uVar4 = -(uint)(fVar6 <= local_24);
      *(ulong *)((long)entry + 0x14) =
           CONCAT44(~uVar4 & (uint)fVar6,~uVar3 & (uint)fVar5) |
           CONCAT44((uint)local_24 & uVar4,(uint)local_20 & uVar3);
    }
    else {
      iVar2 = __isoc99_sscanf(line,"Collapsed=%d",&local_1c);
      if (iVar2 == 1) {
        *(bool *)((long)entry + 0x1c) = local_1c != 0;
      }
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_ReadLine(ImGuiContext* ctx, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiContext& g = *ctx;
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    float x, y;
    int i;
    if (sscanf(line, "Pos=%f,%f", &x, &y) == 2)         settings->Pos = ImVec2(x, y);
    else if (sscanf(line, "Size=%f,%f", &x, &y) == 2)   settings->Size = ImMax(ImVec2(x, y), g.Style.WindowMinSize);
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     settings->Collapsed = (i != 0);
}